

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_INIT_HANDLE sasl_init_create(char *mechanism_value)

{
  int iVar1;
  SASL_INIT_INSTANCE_TAG SVar2;
  AMQP_VALUE item_value;
  undefined4 local_24;
  int result;
  AMQP_VALUE mechanism_amqp_value;
  SASL_INIT_INSTANCE *sasl_init_instance;
  char *mechanism_value_local;
  
  mechanism_amqp_value = (AMQP_VALUE)malloc(8);
  if (mechanism_amqp_value != (AMQP_VALUE)0x0) {
    SVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x41);
    *(AMQP_VALUE *)mechanism_amqp_value = SVar2.composite_value;
    if (*(AMQP_VALUE *)mechanism_amqp_value == (AMQP_VALUE)0x0) {
      free(mechanism_amqp_value);
      mechanism_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_24 = 0;
      item_value = amqpvalue_create_symbol(mechanism_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)mechanism_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_24 = 0x2901;
      }
      amqpvalue_destroy(item_value);
      if (local_24 != 0) {
        sasl_init_destroy((SASL_INIT_HANDLE)mechanism_amqp_value);
        mechanism_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (SASL_INIT_HANDLE)mechanism_amqp_value;
}

Assistant:

SASL_INIT_HANDLE sasl_init_create(const char* mechanism_value)
{
    SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)malloc(sizeof(SASL_INIT_INSTANCE));
    if (sasl_init_instance != NULL)
    {
        sasl_init_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(65);
        if (sasl_init_instance->composite_value == NULL)
        {
            free(sasl_init_instance);
            sasl_init_instance = NULL;
        }
        else
        {
            AMQP_VALUE mechanism_amqp_value;
            int result = 0;

            mechanism_amqp_value = amqpvalue_create_symbol(mechanism_value);
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_init_instance->composite_value, 0, mechanism_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(mechanism_amqp_value);
            if (result != 0)
            {
                sasl_init_destroy(sasl_init_instance);
                sasl_init_instance = NULL;
            }
        }
    }

    return sasl_init_instance;
}